

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_impl.c
# Opt level: O0

plugin plugin_create(char *name,plugin_descriptor descriptor,void *iface,void *impl,
                    _func_void_plugin *dtor)

{
  size_t sVar1;
  ulong __size;
  char *pcVar2;
  void *in_RCX;
  void *in_RDX;
  plugin_descriptor in_RSI;
  char *in_RDI;
  _func_void_plugin *in_R8;
  plugin p;
  size_t name_size;
  plugin local_8;
  
  if (in_RDI == (char *)0x0) {
    log_write_impl_va("metacall",0x2e,"plugin_create",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_impl.c"
                      ,3,"Invalid plugin name");
    local_8 = (plugin)0x0;
  }
  else {
    sVar1 = strlen(in_RDI);
    __size = sVar1 + 1;
    if (__size < 2) {
      log_write_impl_va("metacall",0x36,"plugin_create",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_impl.c"
                        ,3,"Invalid plugin name length");
      local_8 = (plugin)0x0;
    }
    else {
      local_8 = (plugin)malloc(0x28);
      if (local_8 == (plugin)0x0) {
        log_write_impl_va("metacall",0x3e,"plugin_create",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_impl.c"
                          ,3,"Invalid plugin allocation");
        local_8 = (plugin)0x0;
      }
      else {
        local_8->descriptor = in_RSI;
        local_8->iface = in_RDX;
        local_8->impl = in_RCX;
        local_8->dtor = in_R8;
        pcVar2 = (char *)malloc(__size);
        local_8->name = pcVar2;
        if (local_8->name == (char *)0x0) {
          log_write_impl_va("metacall",0x4a,"plugin_create",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_impl.c"
                            ,3,"Invalid plugin name allocation");
          plugin_destroy((plugin)0x10272f);
          local_8 = (plugin)0x0;
        }
        else {
          memcpy(local_8->name,in_RDI,__size);
        }
      }
    }
  }
  return local_8;
}

Assistant:

plugin plugin_create(const char *name, plugin_descriptor descriptor, void *iface, void *impl, void (*dtor)(plugin))
{
	if (name == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin name");
		return NULL;
	}

	size_t name_size = strlen(name) + 1;

	if (name_size <= 1)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin name length");
		return NULL;
	}

	plugin p = malloc(sizeof(struct plugin_type));

	if (p == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin allocation");
		return NULL;
	}

	p->descriptor = descriptor;
	p->iface = iface;
	p->impl = impl;
	p->dtor = dtor;
	p->name = malloc(sizeof(char) * name_size);

	if (p->name == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin name allocation");
		plugin_destroy(p);
		return NULL;
	}

	memcpy(p->name, name, name_size);

	return p;
}